

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_build_compound_diffwtd_mask_d16_c
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,CONV_BUF_TYPE *src0,int src0_stride,
               CONV_BUF_TYPE *src1,int src1_stride,int h,int w,ConvolveParams *conv_params,int bd)

{
  undefined4 in_ECX;
  int unaff_EBX;
  ConvolveParams *unaff_RBP;
  char in_SIL;
  int in_EDI;
  undefined8 in_R8;
  uint in_R9D;
  int unaff_retaddr;
  CONV_BUF_TYPE *in_stack_00000018;
  int in_stack_ffffffffffffffbc;
  int which_inverse;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffe0;
  
  which_inverse = (int)((ulong)in_R8 >> 0x20);
  if (in_SIL == '\0') {
    diffwtd_mask_d16((uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),which_inverse,(int)in_R8,
                     (CONV_BUF_TYPE *)((ulong)in_R9D << 0x20),in_stack_ffffffffffffffbc,
                     in_stack_00000018,in_stack_ffffffffffffffe0,in_EDI,unaff_EBX,unaff_RBP,
                     unaff_retaddr);
  }
  else if (in_SIL == '\x01') {
    diffwtd_mask_d16((uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd0),which_inverse,(int)in_R8,
                     (CONV_BUF_TYPE *)CONCAT44(in_R9D,1),in_stack_ffffffffffffffbc,in_stack_00000018
                     ,in_stack_ffffffffffffffe0,in_EDI,unaff_EBX,unaff_RBP,unaff_retaddr);
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_d16_c(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const CONV_BUF_TYPE *src0,
    int src0_stride, const CONV_BUF_TYPE *src1, int src1_stride, int h, int w,
    ConvolveParams *conv_params, int bd) {
  switch (mask_type) {
    case DIFFWTD_38:
      diffwtd_mask_d16(mask, 0, 38, src0, src0_stride, src1, src1_stride, h, w,
                       conv_params, bd);
      break;
    case DIFFWTD_38_INV:
      diffwtd_mask_d16(mask, 1, 38, src0, src0_stride, src1, src1_stride, h, w,
                       conv_params, bd);
      break;
    default: assert(0);
  }
}